

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

size_t wabt::ReadS32Leb128(uint8_t *p,uint8_t *end,uint32_t *out_value)

{
  uint8_t uVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  
  if ((p < end) && (-1 < (char)*p)) {
    uVar4 = ((int)(char)*p << 0x19) >> 0x19;
    sVar3 = 1;
  }
  else if ((p + 1 < end) && (uVar1 = p[1], -1 < (char)uVar1)) {
    uVar4 = (int)((*p & 0x7f) << 0x12 | (int)(char)uVar1 << 0x19) >> 0x12;
    sVar3 = 2;
  }
  else if ((p + 2 < end) && (uVar1 = p[2], -1 < (char)uVar1)) {
    uVar4 = (int)((*p & 0x7f) << 0xb | (p[1] & 0x7f) << 0x12 | (int)(char)uVar1 << 0x19) >> 0xb;
    sVar3 = 3;
  }
  else {
    if ((end <= p + 3) || (uVar1 = p[3], (char)uVar1 < '\0')) {
      if (p + 4 < end) {
        bVar2 = p[4];
        if ((-1 < (char)bVar2) && ((bVar2 & 0x70) == ((int)((uint)bVar2 << 0x1c) >> 0x1f & 0x70U)))
        {
          uVar4 = *p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15 |
                  (uint)bVar2 << 0x1c;
          sVar3 = 5;
          goto LAB_0012bfad;
        }
      }
      return 0;
    }
    uVar4 = (int)((*p & 0x7f) << 4 | (p[1] & 0x7f) << 0xb | (p[2] & 0x7f) << 0x12 |
                 (int)(char)uVar1 << 0x19) >> 4;
    sVar3 = 4;
  }
LAB_0012bfad:
  *out_value = uVar4;
  return sVar3;
}

Assistant:

size_t ReadS32Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint32_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    uint32_t result = LEB128_1(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 6);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    uint32_t result = LEB128_2(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 13);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    uint32_t result = LEB128_3(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 20);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    uint32_t result = LEB128_4(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 27);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    // The top bits should be a sign-extension of the sign bit.
    bool sign_bit_set = (p[4] & 0x8);
    int top_bits = p[4] & 0xf0;
    if ((sign_bit_set && top_bits != 0x70) ||
        (!sign_bit_set && top_bits != 0)) {
      return 0;
    }
    uint32_t result = LEB128_5(uint32_t);
    *out_value = result;
    return 5;
  } else {
    // Past the end.
    return 0;
  }
}